

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_free(Terminal *term)

{
  beeptime *ptr;
  void *ptr_00;
  termline *ptVar1;
  wchar_t local_24;
  wchar_t i;
  beeptime *beep;
  termline *line;
  Terminal *term_local;
  
  while (ptr_00 = delpos234(term->scrollback,0), ptr_00 != (void *)0x0) {
    safefree(ptr_00);
  }
  freetree234(term->scrollback);
  while (ptVar1 = (termline *)delpos234(term->screen,0), ptVar1 != (termline *)0x0) {
    freetermline(ptVar1);
  }
  freetree234(term->screen);
  while (ptVar1 = (termline *)delpos234(term->alt_screen,0), ptVar1 != (termline *)0x0) {
    freetermline(ptVar1);
  }
  freetree234(term->alt_screen);
  if (term->disptext != (termline **)0x0) {
    for (local_24 = L'\0'; local_24 < term->rows; local_24 = local_24 + L'\x01') {
      freetermline(term->disptext[local_24]);
    }
  }
  safefree(term->disptext);
  while (term->beephead != (beeptime *)0x0) {
    ptr = term->beephead;
    term->beephead = ptr->next;
    safefree(ptr);
  }
  bufchain_clear(&term->inbuf);
  if (term->print_job != (printer_job *)0x0) {
    printer_finish_job(term->print_job);
  }
  bufchain_clear(&term->printer_buf);
  safefree(term->paste_buffer);
  safefree(term->ltemp);
  safefree(term->wcFrom);
  safefree(term->wcTo);
  safefree(term->answerback);
  for (local_24 = 0; (ulong)(long)local_24 < term->bidi_cache_size; local_24 = local_24 + 1) {
    safefree(term->pre_bidi_cache[local_24].chars);
    safefree(term->post_bidi_cache[local_24].chars);
    safefree(term->post_bidi_cache[local_24].forward);
    safefree(term->post_bidi_cache[local_24].backward);
  }
  safefree(term->pre_bidi_cache);
  safefree(term->post_bidi_cache);
  safefree(term->tabs);
  expire_timer_context(term);
  delete_callbacks_for_context(term);
  conf_free(term->conf);
  safefree(term->window_title);
  safefree(term->icon_title);
  bidi_free_context(term->bidi_ctx);
  safefree(term);
  return;
}

Assistant:

void term_free(Terminal *term)
{
    termline *line;
    struct beeptime *beep;
    int i;

    while ((line = delpos234(term->scrollback, 0)) != NULL)
        sfree(line);                   /* compressed data, not a termline */
    freetree234(term->scrollback);
    while ((line = delpos234(term->screen, 0)) != NULL)
        freetermline(line);
    freetree234(term->screen);
    while ((line = delpos234(term->alt_screen, 0)) != NULL)
        freetermline(line);
    freetree234(term->alt_screen);
    if (term->disptext) {
        for (i = 0; i < term->rows; i++)
            freetermline(term->disptext[i]);
    }
    sfree(term->disptext);
    while (term->beephead) {
        beep = term->beephead;
        term->beephead = beep->next;
        sfree(beep);
    }
    bufchain_clear(&term->inbuf);
    if(term->print_job)
        printer_finish_job(term->print_job);
    bufchain_clear(&term->printer_buf);
    sfree(term->paste_buffer);
    sfree(term->ltemp);
    sfree(term->wcFrom);
    sfree(term->wcTo);
    sfree(term->answerback);

    for (i = 0; i < term->bidi_cache_size; i++) {
        sfree(term->pre_bidi_cache[i].chars);
        sfree(term->post_bidi_cache[i].chars);
        sfree(term->post_bidi_cache[i].forward);
        sfree(term->post_bidi_cache[i].backward);
    }
    sfree(term->pre_bidi_cache);
    sfree(term->post_bidi_cache);

    sfree(term->tabs);

    expire_timer_context(term);
    delete_callbacks_for_context(term);

    conf_free(term->conf);

    sfree(term->window_title);
    sfree(term->icon_title);

    bidi_free_context(term->bidi_ctx);

    sfree(term);
}